

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<std::complex<float>_>::SolveSOR
          (TPZMatrix<std::complex<float>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<float>_> *F,TPZFMatrix<std::complex<float>_> *result,
          TPZFMatrix<std::complex<float>_> *residual,TPZFMatrix<std::complex<float>_> *param_5,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  double dVar1;
  int iVar2;
  int extraout_var;
  complex<float> *pcVar4;
  int64_t j;
  long row;
  long lVar5;
  int64_t ic;
  long col;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  complex<float> local_b8;
  undefined8 local_b0;
  complex<float> local_a8;
  TPZFMatrix<std::complex<float>_> *local_a0;
  float local_94;
  double *local_90;
  long *local_88;
  float local_80 [2];
  undefined8 local_78;
  TPZFMatrix<std::complex<float>_> *local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  complex<float> local_38;
  long lVar3;
  
  local_a0 = F;
  local_88 = numiterations;
  if (residual == F) {
    std::operator<<((ostream *)&std::cout,
                    "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
    return;
  }
  local_b0 = 0x40000000;
  local_90 = tol;
  local_a8._M_value._4_4_ = 0;
  local_a8._M_value._0_4_ = (float)*tol;
  local_78 = overrelax;
  std::operator*((complex<float> *)&local_b0,&local_a8);
  local_b8._M_value = CONCAT44(extraout_XMM0_Db + 0.0,extraout_XMM0_Da + 1.0);
  if (residual != (TPZFMatrix<std::complex<float>_> *)0x0) {
    local_b8._M_value._0_4_ = Norm(residual);
    local_b8._M_value._4_4_ = 0;
  }
  local_68 = residual;
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar3 = CONCAT44(extraout_var,iVar2);
  local_50 = (local_a0->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  lVar5 = 0;
  local_58 = lVar3 + -1;
  local_40 = -1;
  if (direction != -1) {
    local_58 = lVar5;
    local_40 = lVar3;
  }
  local_b0._0_4_ = 0.0;
  local_b0._4_4_ = 0.0;
  local_94 = (float)local_78;
  local_48 = (ulong)(direction != -1) * 2 + -1;
  if (lVar3 == 0 || extraout_var < 0) {
    lVar3 = lVar5;
  }
  if (local_50 < 1) {
    local_50 = lVar5;
  }
  while ((lVar5 < *local_88 &&
         (dVar1 = fabs((double)local_b8._M_value), ABS(*local_90) < (double)SUB84(dVar1,0)))) {
    local_b8._M_value = 0;
    local_60 = lVar5;
    for (col = 0; lVar5 = local_58, col != local_50; col = col + 1) {
      for (; lVar5 != local_40; lVar5 = lVar5 + local_48) {
        (*(local_a0->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(local_a0,lVar5,col);
        local_b0._0_4_ = extraout_XMM0_Da_00;
        local_b0._4_4_ = extraout_XMM0_Db_00;
        for (row = 0; lVar3 != row; row = row + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,row);
          local_a8._M_value = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
          pcVar4 = TPZFMatrix<std::complex<float>_>::operator()(result,row,col);
          std::operator*(&local_a8,pcVar4);
          local_b0._0_4_ = (float)local_b0 - extraout_XMM0_Da_02;
          local_b0._4_4_ = local_b0._4_4_ - extraout_XMM0_Db_02;
        }
        std::operator*((complex<float> *)&local_b0,(complex<float> *)&local_b0);
        local_b8._M_value =
             CONCAT44((float)(local_b8._M_value >> 0x20) + extraout_XMM0_Db_03,
                      (float)local_b8._M_value + extraout_XMM0_Da_03);
        local_80[0] = local_94;
        local_80[1] = 0.0;
        std::operator*((complex<float> *)local_80,(complex<float> *)&local_b0);
        local_a8._M_value = CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar5);
        std::operator/(&local_a8,&local_38);
        local_78 = (REAL)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
        pcVar4 = TPZFMatrix<std::complex<float>_>::operator()(result,lVar5,col);
        pcVar4->_M_value =
             CONCAT44((float)(pcVar4->_M_value >> 0x20) + local_78._4_4_,
                      (float)pcVar4->_M_value + (float)local_78);
      }
    }
    std::sqrt<float>(&local_b8);
    local_b8._M_value = CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
    lVar5 = local_60 + 1;
  }
  if (local_68 != (TPZFMatrix<std::complex<float>_> *)0x0) {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,local_a0);
  }
  *local_88 = lVar5;
  dVar1 = fabs((double)local_b8._M_value);
  *local_90 = (double)SUB84(dVar1,0);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}